

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O0

void chacha_init(chacha_state *S,chacha_key *key,chacha_iv *iv,size_t rounds)

{
  undefined8 in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  chacha_state_internal *state;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = in_RSI[1];
  in_RDI[2] = in_RSI[2];
  in_RDI[3] = in_RSI[3];
  memset(in_RDI + 4,0,8);
  in_RDI[5] = *in_RDX;
  in_RDI[6] = in_RCX;
  in_RDI[7] = 0;
  return;
}

Assistant:

void
chacha_init(chacha_state *S, const chacha_key *key, const chacha_iv *iv, size_t rounds) {
    chacha_state_internal *state = (chacha_state_internal *)S;
    memcpy(state->s + 0, key, 32);
    memset(state->s + 32, 0, 8);
    memcpy(state->s + 40, iv, 8);
    state->rounds = rounds;
    state->leftover = 0;
}